

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.cpp
# Opt level: O0

int language::formatEscapedNumber(QTextStream *str,ushort value,int base,int width,char prefix)

{
  int in_ECX;
  ushort in_SI;
  FieldAlignment FVar1;
  QTextStream *in_RDI;
  char in_R8B;
  long in_FS_OFFSET;
  int oldIntegerBase;
  FieldAlignment oldFieldAlignment;
  int oldFieldWidth;
  int length;
  QChar oldPadChar;
  int local_2c;
  QChar local_c;
  undefined2 local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c = in_ECX + 1;
  QTextStream::operator<<(in_RDI,'\\');
  if (in_R8B != '\0') {
    QTextStream::operator<<(in_RDI,in_R8B);
    local_2c = in_ECX + 2;
  }
  local_a = 0xaaaa;
  local_a = QTextStream::padChar();
  QTextStream::fieldWidth();
  QTextStream::fieldAlignment();
  QTextStream::integerBase();
  QChar::QChar<char16_t,_true>(&local_c,L'0');
  QTextStream::setPadChar((QChar)(char16_t)in_RDI);
  FVar1 = (FieldAlignment)in_RDI;
  QTextStream::setFieldWidth(FVar1);
  QTextStream::setFieldAlignment(FVar1);
  QTextStream::setIntegerBase(FVar1);
  QTextStream::operator<<(in_RDI,in_SI);
  QTextStream::setIntegerBase(FVar1);
  QTextStream::setFieldAlignment(FVar1);
  QTextStream::setFieldWidth(FVar1);
  QTextStream::setPadChar((QChar)(char16_t)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_2c;
  }
  __stack_chk_fail();
}

Assistant:

static int formatEscapedNumber(QTextStream &str, ushort value, int base, int width,
                               char prefix = 0)
{
    int length = 1 + width;
    str << '\\';
    if (prefix) {
        str << prefix;
        ++length;
    }
    const auto oldPadChar = str.padChar();
    const auto oldFieldWidth = str.fieldWidth();
    const auto oldFieldAlignment = str.fieldAlignment();
    const auto oldIntegerBase = str.integerBase();
    str.setPadChar(u'0');
    str.setFieldWidth(width);
    str.setFieldAlignment(QTextStream::AlignRight);
    str.setIntegerBase(base);
    str << value;
    str.setIntegerBase(oldIntegerBase);
    str.setFieldAlignment(oldFieldAlignment);
    str.setFieldWidth(oldFieldWidth);
    str.setPadChar(oldPadChar);
    return length;
}